

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_44defc::QDynamicFileResourceRoot::~QDynamicFileResourceRoot
          (QDynamicFileResourceRoot *this)

{
  uchar *puVar1;
  Data *pDVar2;
  
  (this->super_QDynamicBufferResourceRoot).super_QResourceRoot._vptr_QResourceRoot =
       (_func_int **)&PTR__QDynamicFileResourceRoot_00697608;
  if (this->unmapPointer == (uchar *)0x0) {
    puVar1 = (this->super_QDynamicBufferResourceRoot).buffer;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
    }
  }
  else {
    munmap(this->unmapPointer,this->unmapLength);
  }
  pDVar2 = (this->fileName).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->fileName).d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->super_QDynamicBufferResourceRoot).super_QResourceRoot._vptr_QResourceRoot =
       (_func_int **)&PTR__QDynamicBufferResourceRoot_00697668;
  pDVar2 = (this->super_QDynamicBufferResourceRoot).root.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->super_QDynamicBufferResourceRoot).root.d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~QDynamicFileResourceRoot() {
        if (wasMemoryMapped())
            unmap_sys(unmapPointer, unmapLength);
        else
            delete[] mappingBuffer();
    }